

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int64_t GetFilPos(GmfMshSct *msh)

{
  long lVar1;
  long in_RDI;
  
  lVar1 = ftell(*(FILE **)(in_RDI + 0x300410));
  return lVar1;
}

Assistant:

static int64_t GetFilPos(GmfMshSct *msh)
{
#ifdef WITH_GMF_AIO
   if(msh->typ & Bin)
      return(lseek(msh->FilDes, 0, 1));
   else
      return(MYFTELL(msh->hdl));
#else
   return(MYFTELL(msh->hdl));
#endif
}